

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::MergeReturnPass::RecordReturned(MergeReturnPass *this,BasicBlock *block)

{
  IRContext *c;
  _func_int **inst;
  int iVar1;
  TypeManager *this_00;
  Type *pTVar2;
  undefined4 extraout_var;
  ConstantManager *this_01;
  Constant *c_00;
  Instruction *pIVar3;
  Instruction *this_02;
  long lVar4;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_100;
  uint32_t local_fc;
  undefined1 local_f8 [80];
  Bool temp;
  SmallVector<unsigned_int,_2UL> local_70;
  pointer local_48;
  pointer pIStack_40;
  pointer local_38;
  
  BasicBlock::tail((BasicBlock *)&temp);
  if ((*(int *)(temp.super_Type._vptr_Type + 5) != 0xfd) &&
     (BasicBlock::tail((BasicBlock *)local_f8),
     *(int *)&(((InstructionList *)(local_f8._0_8_ + 0x20))->
              super_IntrusiveList<spvtools::opt::Instruction>).sentinel_.
              super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase != 0xfe))
  {
    return;
  }
  pIVar3 = this->return_flag_;
  if (pIVar3 != (Instruction *)0x0) {
    if (this->constant_true_ == (Instruction *)0x0) {
      temp.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      temp.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      temp.super_Type.decorations_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      temp.super_Type._vptr_Type = (_func_int **)&PTR__Type_003aed10;
      temp.super_Type.kind_ = kBool;
      this_00 = IRContext::get_type_mgr((this->super_MemPass).super_Pass.context_);
      pTVar2 = analysis::TypeManager::GetRegisteredType(this_00,&temp.super_Type);
      iVar1 = (*pTVar2->_vptr_Type[7])(pTVar2);
      this_01 = IRContext::get_constant_mgr((this->super_MemPass).super_Pass.context_);
      local_f8._0_8_ = (Function *)0x0;
      local_f8._8_8_ =
           (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            )0x0;
      local_f8._16_4_ = (array<signed_char,_4UL>)0x0;
      local_f8._20_4_ = (array<signed_char,_4UL>)0x0;
      local_f8._40_4_ = kBool;
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_initialize<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_f8,local_f8 + 0x28);
      c_00 = analysis::ConstantManager::GetConstant
                       (this_01,(Type *)CONCAT44(extraout_var,iVar1),
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_f8);
      pIVar3 = analysis::ConstantManager::GetDefiningInstruction
                         (this_01,c_00,0,(inst_iterator *)0x0);
      this->constant_true_ = pIVar3;
      IRContext::UpdateDefUse((this->super_MemPass).super_Pass.context_,pIVar3);
      analysis::Type::~Type(&temp.super_Type);
      pIVar3 = this->return_flag_;
    }
    this_02 = (Instruction *)operator_new(0x70);
    c = (this->super_MemPass).super_Pass.context_;
    local_fc = Instruction::result_id(pIVar3);
    init_list._M_len = 1;
    init_list._M_array = &local_fc;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)local_f8,init_list);
    temp.super_Type._vptr_Type = (_func_int **)CONCAT44(temp.super_Type._vptr_Type._4_4_,1);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&temp.super_Type.decorations_,
               (SmallVector<unsigned_int,_2UL> *)local_f8);
    local_100 = Instruction::result_id(this->constant_true_);
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_100;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_f8 + 0x28),init_list_00);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              (&local_70,(SmallVector<unsigned_int,_2UL> *)(local_f8 + 0x28));
    local_48 = (pointer)0x0;
    pIStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               &temp,&local_48);
    Instruction::Instruction(this_02,c,OpStore,0,0,(OperandList *)&local_48);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48)
    ;
    lVar4 = 0x38;
    do {
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                ((SmallVector<unsigned_int,_2UL> *)((long)&temp.super_Type._vptr_Type + lVar4));
      lVar4 = lVar4 + -0x30;
    } while (lVar4 != -0x28);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_f8 + 0x28));
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)local_f8);
    BasicBlock::tail((BasicBlock *)local_f8);
    InstructionList::iterator::InsertBefore
              ((iterator *)&temp,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)local_f8);
    inst = temp.super_Type._vptr_Type;
    IRContext::set_instr_block
              ((this->super_MemPass).super_Pass.context_,(Instruction *)temp.super_Type._vptr_Type,
               block);
    IRContext::AnalyzeDefUse((this->super_MemPass).super_Pass.context_,(Instruction *)inst);
    if (this_02 != (Instruction *)0x0) {
      (*(this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])()
      ;
    }
    return;
  }
  __assert_fail("return_flag_ && \"Did not generate the return flag variable.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                ,0x21f,"void spvtools::opt::MergeReturnPass::RecordReturned(BasicBlock *)");
}

Assistant:

void MergeReturnPass::RecordReturned(BasicBlock* block) {
  if (block->tail()->opcode() != spv::Op::OpReturn &&
      block->tail()->opcode() != spv::Op::OpReturnValue)
    return;

  assert(return_flag_ && "Did not generate the return flag variable.");

  if (!constant_true_) {
    analysis::Bool temp;
    const analysis::Bool* bool_type =
        context()->get_type_mgr()->GetRegisteredType(&temp)->AsBool();

    analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
    const analysis::Constant* true_const =
        const_mgr->GetConstant(bool_type, {true});
    constant_true_ = const_mgr->GetDefiningInstruction(true_const);
    context()->UpdateDefUse(constant_true_);
  }

  std::unique_ptr<Instruction> return_store(new Instruction(
      context(), spv::Op::OpStore, 0, 0,
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {return_flag_->result_id()}},
          {SPV_OPERAND_TYPE_ID, {constant_true_->result_id()}}}));

  Instruction* store_inst =
      &*block->tail().InsertBefore(std::move(return_store));
  context()->set_instr_block(store_inst, block);
  context()->AnalyzeDefUse(store_inst);
}